

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O2

void DrawRectanglePro(Rectangle rec,Vector2 origin,float rotation,Color color)

{
  undefined8 uVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  fVar5 = origin.x;
  fVar7 = origin.y;
  local_48 = rec.x;
  uStack_44 = rec.y;
  if ((rotation != 0.0) || (NAN(rotation))) {
    fVar3 = sinf(rotation * 0.017453292);
    fVar4 = cosf(rotation * 0.017453292);
    fVar9 = rec.width - fVar5;
    fVar10 = rec.height - fVar7;
    fVar6 = fVar3 * fVar9 + uStack_44;
    fVar8 = fVar3 * -fVar5 + uStack_44;
    fVar9 = fVar4 * fVar9 + local_48;
    fVar5 = fVar4 * -fVar5 + local_48;
    uStack_44 = -fVar7 * fVar4 + fVar6;
    local_48 = -fVar10 * fVar3 + fVar5;
    uStack_40 = fVar7 * fVar3 + fVar5;
    uStack_3c = -fVar7 * fVar4 + fVar8;
    fVar5 = fVar3 * -fVar10 + fVar9;
    fVar6 = fVar4 * fVar10 + fVar6;
    fVar9 = fVar3 * fVar7 + fVar9;
    fVar8 = fVar4 * fVar10 + fVar8;
  }
  else {
    local_48 = local_48 - fVar5;
    uStack_44 = uStack_44 - fVar7;
    fVar5 = rec.width + local_48;
    fVar6 = rec.height + uStack_44;
    uStack_40 = local_48;
    uStack_3c = uStack_44;
    fVar9 = fVar5;
    fVar8 = fVar6;
  }
  rlSetTexture(texShapes.id);
  uVar2 = texShapesRec._8_8_;
  uVar1 = texShapesRec._0_8_;
  rlBegin(7);
  rlNormal3f(0.0,0.0,1.0);
  rlColor4ub(color.r,color.g,color.b,color.a);
  local_78 = (float)uVar1;
  uStack_74 = SUB84(uVar1,4);
  rlTexCoord2f(local_78 / (float)texShapes.width,uStack_74 / (float)texShapes.height);
  rlVertex2f(uStack_40,uStack_3c);
  local_68 = (float)uVar2;
  uStack_64 = SUB84(uVar2,4);
  rlTexCoord2f(local_78 / (float)texShapes.width,(uStack_64 + uStack_74) / (float)texShapes.height);
  rlVertex2f(local_48,fVar8);
  rlTexCoord2f((local_68 + local_78) / (float)texShapes.width,
               (uStack_64 + uStack_74) / (float)texShapes.height);
  rlVertex2f(fVar5,fVar6);
  rlTexCoord2f((local_68 + local_78) / (float)texShapes.width,uStack_74 / (float)texShapes.height);
  rlVertex2f(fVar9,uStack_44);
  rlEnd();
  rlSetTexture(0);
  return;
}

Assistant:

void DrawRectanglePro(Rectangle rec, Vector2 origin, float rotation, Color color)
{
    Vector2 topLeft = { 0 };
    Vector2 topRight = { 0 };
    Vector2 bottomLeft = { 0 };
    Vector2 bottomRight = { 0 };

    // Only calculate rotation if needed
    if (rotation == 0.0f)
    {
        float x = rec.x - origin.x;
        float y = rec.y - origin.y;
        topLeft = (Vector2){ x, y };
        topRight = (Vector2){ x + rec.width, y };
        bottomLeft = (Vector2){ x, y + rec.height };
        bottomRight = (Vector2){ x + rec.width, y + rec.height };
    }
    else
    {
        float sinRotation = sinf(rotation*DEG2RAD);
        float cosRotation = cosf(rotation*DEG2RAD);
        float x = rec.x;
        float y = rec.y;
        float dx = -origin.x;
        float dy = -origin.y;

        topLeft.x = x + dx*cosRotation - dy*sinRotation;
        topLeft.y = y + dx*sinRotation + dy*cosRotation;

        topRight.x = x + (dx + rec.width)*cosRotation - dy*sinRotation;
        topRight.y = y + (dx + rec.width)*sinRotation + dy*cosRotation;

        bottomLeft.x = x + dx*cosRotation - (dy + rec.height)*sinRotation;
        bottomLeft.y = y + dx*sinRotation + (dy + rec.height)*cosRotation;

        bottomRight.x = x + (dx + rec.width)*cosRotation - (dy + rec.height)*sinRotation;
        bottomRight.y = y + (dx + rec.width)*sinRotation + (dy + rec.height)*cosRotation;
    }

#if defined(SUPPORT_QUADS_DRAW_MODE)
    rlSetTexture(GetShapesTexture().id);
    Rectangle shapeRect = GetShapesTextureRectangle();

    rlBegin(RL_QUADS);

        rlNormal3f(0.0f, 0.0f, 1.0f);
        rlColor4ub(color.r, color.g, color.b, color.a);

        rlTexCoord2f(shapeRect.x/texShapes.width, shapeRect.y/texShapes.height);
        rlVertex2f(topLeft.x, topLeft.y);

        rlTexCoord2f(shapeRect.x/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
        rlVertex2f(bottomLeft.x, bottomLeft.y);

        rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
        rlVertex2f(bottomRight.x, bottomRight.y);

        rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, shapeRect.y/texShapes.height);
        rlVertex2f(topRight.x, topRight.y);

    rlEnd();

    rlSetTexture(0);
#else
    rlBegin(RL_TRIANGLES);

        rlColor4ub(color.r, color.g, color.b, color.a);

        rlVertex2f(topLeft.x, topLeft.y);
        rlVertex2f(bottomLeft.x, bottomLeft.y);
        rlVertex2f(topRight.x, topRight.y);

        rlVertex2f(topRight.x, topRight.y);
        rlVertex2f(bottomLeft.x, bottomLeft.y);
        rlVertex2f(bottomRight.x, bottomRight.y);

    rlEnd();
#endif
}